

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void embree::error_handler(void *userPtr,RTCError code,char *str)

{
  undefined8 uVar1;
  char *in_RDX;
  int in_ESI;
  char *local_18;
  
  if (in_ESI == 0) {
    return;
  }
  uVar1 = rtcGetErrorString(in_ESI);
  printf("Embree: %s",uVar1);
  if (in_RDX == (char *)0x0) {
    printf("\n");
  }
  else {
    printf(" (");
    local_18 = in_RDX;
    while (*local_18 != '\0') {
      putchar((int)*local_18);
      local_18 = local_18 + 1;
    }
    printf(")\n");
  }
  exit(1);
}

Assistant:

void error_handler(void* userPtr, const RTCError code, const char* str)
  {
    if (code == RTC_ERROR_NONE)
      return;

    printf("Embree: %s", rtcGetErrorString(code));
    if (str) {
      printf(" (");
      while (*str) putchar(*str++);
      printf(")\n");
    } else {
      printf("\n");
    }
    exit(1);
  }